

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O0

void rt_map4cols_c(int sx,int yl,int yh)

{
  int iVar1;
  lighttable_t *plVar2;
  uint uVar3;
  int iVar4;
  int pitch;
  int count;
  BYTE *dest;
  BYTE *source;
  BYTE *colormap;
  int yh_local;
  int yl_local;
  int sx_local;
  
  plVar2 = dc_colormap;
  iVar1 = dc_pitch;
  if (-1 < yh - yl) {
    uVar3 = (yh - yl) + 1;
    _pitch = dc_destorg + (ylookup[yl] + sx);
    dest = dc_temp + (yl << 2);
    if ((uVar3 & 1) != 0) {
      *_pitch = dc_colormap[*dest];
      _pitch[1] = plVar2[dest[1]];
      _pitch[2] = plVar2[dest[2]];
      _pitch[3] = plVar2[dest[3]];
      dest = dest + 4;
      _pitch = _pitch + iVar1;
    }
    for (iVar4 = (int)uVar3 >> 1; iVar4 != 0; iVar4 = iVar4 + -1) {
      *_pitch = plVar2[*dest];
      _pitch[1] = plVar2[dest[1]];
      _pitch[2] = plVar2[dest[2]];
      _pitch[3] = plVar2[dest[3]];
      _pitch[iVar1] = plVar2[dest[4]];
      _pitch[iVar1 + 1] = plVar2[dest[5]];
      _pitch[iVar1 + 2] = plVar2[dest[6]];
      _pitch[iVar1 + 3] = plVar2[dest[7]];
      dest = dest + 8;
      _pitch = _pitch + (iVar1 << 1);
    }
  }
  return;
}

Assistant:

void rt_map4cols_c (int sx, int yl, int yh)
{
	BYTE *colormap;
	BYTE *source;
	BYTE *dest;
	int count;
	int pitch;

	count = yh-yl;
	if (count < 0)
		return;
	count++;

	colormap = dc_colormap;
	dest = ylookup[yl] + sx + dc_destorg;
	source = &dc_temp[yl*4];
	pitch = dc_pitch;
	
	if (count & 1) {
		dest[0] = colormap[source[0]];
		dest[1] = colormap[source[1]];
		dest[2] = colormap[source[2]];
		dest[3] = colormap[source[3]];
		source += 4;
		dest += pitch;
	}
	if (!(count >>= 1))
		return;

	do {
		dest[0] = colormap[source[0]];
		dest[1] = colormap[source[1]];
		dest[2] = colormap[source[2]];
		dest[3] = colormap[source[3]];
		dest[pitch] = colormap[source[4]];
		dest[pitch+1] = colormap[source[5]];
		dest[pitch+2] = colormap[source[6]];
		dest[pitch+3] = colormap[source[7]];
		source += 8;
		dest += pitch*2;
	} while (--count);
}